

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O0

int tc_uECC_valid_public_key(uint8_t *public_key,tc_uECC_Curve curve)

{
  cmpresult_t cVar1;
  uint local_68 [2];
  tc_uECC_word_t _public [16];
  tc_uECC_Curve curve_local;
  uint8_t *public_key_local;
  
  tc_uECC_vli_bytesToNative(local_68,public_key,(int)curve->num_bytes);
  tc_uECC_vli_bytesToNative
            (_public + (long)(int)curve->num_words + -2,public_key + (int)curve->num_bytes,
             (int)curve->num_bytes);
  cVar1 = tc_uECC_vli_cmp_unsafe(local_68,curve->G,'\x10');
  if (cVar1 == '\0') {
    public_key_local._4_4_ = -4;
  }
  else {
    public_key_local._4_4_ = tc_uECC_valid_point(local_68,curve);
  }
  return public_key_local._4_4_;
}

Assistant:

int tc_uECC_valid_public_key(const uint8_t *public_key, tc_uECC_Curve curve)
{

	tc_uECC_word_t _public[NUM_ECC_WORDS * 2];

	tc_uECC_vli_bytesToNative(_public, public_key, curve->num_bytes);
	tc_uECC_vli_bytesToNative(
	_public + curve->num_words,
	public_key + curve->num_bytes,
	curve->num_bytes);

	if (tc_uECC_vli_cmp_unsafe(_public, curve->G, NUM_ECC_WORDS * 2) == 0) {
		return -4;
	}

	return tc_uECC_valid_point(_public, curve);
}